

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_TextRange * ImVector_TextRange_ImVector_TextRangeVector(ImVector_TextRange *src)

{
  ImVector<ImGuiTextFilter::ImGuiTextRange> *this;
  ImVector_TextRange *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<ImGuiTextFilter::ImGuiTextRange> *)operator_new(0x10);
  ImVector<ImGuiTextFilter::ImGuiTextRange>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_TextRange* ImVector_TextRange_ImVector_TextRangeVector(const ImVector_TextRange src)
{
    return IM_NEW(ImVector_TextRange)(src);
}